

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

char * httplib::detail::find_content_type
                 (string *path,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *user_data)

{
  const_iterator cVar1;
  size_type sVar2;
  uint uVar3;
  char *pcVar4;
  string ext;
  string local_30;
  
  file_extension(&local_30,path);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&user_data->_M_t,&local_30);
  if ((_Rb_tree_header *)cVar1._M_node != &(user_data->_M_t)._M_impl.super__Rb_tree_header) {
    pcVar4 = *(char **)(cVar1._M_node + 2);
    goto LAB_001529bd;
  }
  pcVar4 = (char *)0x0;
  if (local_30._M_string_length == 0) goto LAB_001529bd;
  sVar2 = 0;
  do {
    uVar3 = (uint)(byte)local_30._M_dataplus._M_p[sVar2] ^ (int)pcVar4 * 0x21 & 0x3ffffffU;
    pcVar4 = (char *)(ulong)uVar3;
    sVar2 = sVar2 + 1;
  } while (local_30._M_string_length != sVar2);
  if (uVar3 < 0x1f164) {
    if (uVar3 < 0x1d1b9) {
      if (uVar3 < 0x1a6df) {
        if (uVar3 < 0xdd9) {
          if (uVar3 == 0x76d) {
            pcVar4 = "application/x-7z-compressed";
            goto LAB_001529bd;
          }
          if (uVar3 == 0xd3d) {
            pcVar4 = "application/gzip";
            goto LAB_001529bd;
          }
        }
        else {
          if (uVar3 == 0xdd9) {
LAB_00152da9:
            pcVar4 = "text/javascript";
            goto LAB_001529bd;
          }
          if (uVar3 == 0x1a2c3) {
            pcVar4 = "text/css";
            goto LAB_001529bd;
          }
          if (uVar3 == 0x1a2c6) {
            pcVar4 = "text/csv";
            goto LAB_001529bd;
          }
        }
      }
      else if (uVar3 < 0x1c97d) {
        if (uVar3 == 0x1a6df) {
          pcVar4 = "image/bmp";
          goto LAB_001529bd;
        }
        if (uVar3 == 0x1b0f1) goto LAB_00152d91;
        if (uVar3 == 0x1b288) {
          pcVar4 = "image/gif";
          goto LAB_001529bd;
        }
      }
      else {
        if (uVar3 == 0x1c97d) {
LAB_00152c8d:
          pcVar4 = "image/jpeg";
          goto LAB_001529bd;
        }
        if (uVar3 == 0x1cb45) {
          pcVar4 = "image/x-icon";
          goto LAB_001529bd;
        }
        if (uVar3 == 0x1d0f2) {
          pcVar4 = "application/pdf";
          goto LAB_001529bd;
        }
      }
    }
    else if (uVar3 < 0x1dee6) {
      if (uVar3 < 0x1db34) {
        if (uVar3 == 0x1d1b9) {
          pcVar4 = "image/png";
          goto LAB_001529bd;
        }
        if (uVar3 == 0x1d5fd) {
          pcVar4 = "font/otf";
          goto LAB_001529bd;
        }
      }
      else {
        if (uVar3 == 0x1db34) goto LAB_00152da9;
        if (uVar3 == 0x1de29) {
          pcVar4 = "video/mp4";
          goto LAB_001529bd;
        }
        if (uVar3 == 0x1de2e) {
          pcVar4 = "audio/mp3";
          goto LAB_001529bd;
        }
      }
    }
    else if (uVar3 < 0x1e25b) {
      if (uVar3 == 0x1dee6) {
        pcVar4 = "font/ttf";
        goto LAB_001529bd;
      }
      if (uVar3 == 0x1e078) {
        pcVar4 = "text/plain";
        goto LAB_001529bd;
      }
      if (uVar3 == 0x1e147) {
        pcVar4 = "application/x-tar";
        goto LAB_001529bd;
      }
    }
    else {
      if (uVar3 == 0x1e25b) {
LAB_00152d9d:
        pcVar4 = "image/tiff";
        goto LAB_001529bd;
      }
      if (uVar3 == 0x1e322) {
        pcVar4 = "image/svg+xml";
        goto LAB_001529bd;
      }
      if (uVar3 == 0x1e692) {
        pcVar4 = "application/rss+xml";
        goto LAB_001529bd;
      }
    }
  }
  else if (uVar3 < 0x3dad1f) {
    if (uVar3 < 0x371b38) {
      if (uVar3 < 0x1f580) {
        if (uVar3 == 0x1f164) {
LAB_00152d85:
          pcVar4 = "application/xhtml+xml";
          goto LAB_001529bd;
        }
        if (uVar3 == 0x1f1d9) {
          pcVar4 = "application/xml";
          goto LAB_001529bd;
        }
      }
      else {
        if (uVar3 == 0x1f580) {
          pcVar4 = "audio/wave";
          goto LAB_001529bd;
        }
        if (uVar3 == 0x1f7f6) {
          pcVar4 = "text/vtt";
          goto LAB_001529bd;
        }
        if (uVar3 == 0x20a43) {
          pcVar4 = "application/zip";
          goto LAB_001529bd;
        }
      }
    }
    else if (uVar3 < 0x37cf7d) {
      if (uVar3 == 0x371b38) {
        pcVar4 = "image/apng";
        goto LAB_001529bd;
      }
      if (uVar3 == 0x372318) {
        pcVar4 = "image/avif";
        goto LAB_001529bd;
      }
      if (uVar3 == 0x372b57) {
        pcVar4 = "application/atom+xml";
        goto LAB_001529bd;
      }
    }
    else {
      if (uVar3 == 0x37cf7d) {
LAB_00152d91:
        pcVar4 = "text/html";
        goto LAB_001529bd;
      }
      if (uVar3 == 0x3adb38) {
        pcVar4 = "application/json";
        goto LAB_001529bd;
      }
      if (uVar3 == 0x3af938) goto LAB_00152c8d;
    }
  }
  else if (uVar3 < 0x409771) {
    if (uVar3 < 0x3e2ddd) {
      if (uVar3 == 0x3dad1f) {
        pcVar4 = "video/mpeg";
        goto LAB_001529bd;
      }
      if (uVar3 == 0x3daddb) {
        pcVar4 = "audio/mpeg";
        goto LAB_001529bd;
      }
    }
    else {
      if (uVar3 == 0x3e2ddd) goto LAB_00152d9d;
      if (uVar3 == 0x3ff093) {
        pcVar4 = "application/xslt+xml";
        goto LAB_001529bd;
      }
      if (uVar3 == 0x409760) {
        pcVar4 = "image/webp";
        goto LAB_001529bd;
      }
    }
  }
  else if (uVar3 < 0x40c278) {
    if (uVar3 == 0x409771) {
      pcVar4 = "audio/webm";
      goto LAB_001529bd;
    }
    if (uVar3 == 0x40977d) {
      pcVar4 = "video/webm";
      goto LAB_001529bd;
    }
    if (uVar3 == 0x40a648) {
      pcVar4 = "application/wasm";
      goto LAB_001529bd;
    }
  }
  else {
    if (uVar3 == 0x40c278) {
      pcVar4 = "font/woff";
      goto LAB_001529bd;
    }
    if (uVar3 == 0x43cec5) goto LAB_00152d85;
    if (uVar3 == 0x59114a) {
      pcVar4 = "font/woff2";
      goto LAB_001529bd;
    }
  }
  pcVar4 = (char *)0x0;
LAB_001529bd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return pcVar4;
}

Assistant:

inline const char *
find_content_type(const std::string &path,
                  const std::map<std::string, std::string> &user_data) {
  auto ext = file_extension(path);

  auto it = user_data.find(ext);
  if (it != user_data.end()) { return it->second.c_str(); }

  using udl::operator""_t;

  switch (str2tag(ext)) {
  default: return nullptr;
  case "css"_t: return "text/css";
  case "csv"_t: return "text/csv";
  case "htm"_t:
  case "html"_t: return "text/html";
  case "js"_t:
  case "mjs"_t: return "text/javascript";
  case "txt"_t: return "text/plain";
  case "vtt"_t: return "text/vtt";

  case "apng"_t: return "image/apng";
  case "avif"_t: return "image/avif";
  case "bmp"_t: return "image/bmp";
  case "gif"_t: return "image/gif";
  case "png"_t: return "image/png";
  case "svg"_t: return "image/svg+xml";
  case "webp"_t: return "image/webp";
  case "ico"_t: return "image/x-icon";
  case "tif"_t: return "image/tiff";
  case "tiff"_t: return "image/tiff";
  case "jpg"_t:
  case "jpeg"_t: return "image/jpeg";

  case "mp4"_t: return "video/mp4";
  case "mpeg"_t: return "video/mpeg";
  case "webm"_t: return "video/webm";

  case "mp3"_t: return "audio/mp3";
  case "mpga"_t: return "audio/mpeg";
  case "weba"_t: return "audio/webm";
  case "wav"_t: return "audio/wave";

  case "otf"_t: return "font/otf";
  case "ttf"_t: return "font/ttf";
  case "woff"_t: return "font/woff";
  case "woff2"_t: return "font/woff2";

  case "7z"_t: return "application/x-7z-compressed";
  case "atom"_t: return "application/atom+xml";
  case "pdf"_t: return "application/pdf";
  case "json"_t: return "application/json";
  case "rss"_t: return "application/rss+xml";
  case "tar"_t: return "application/x-tar";
  case "xht"_t:
  case "xhtml"_t: return "application/xhtml+xml";
  case "xslt"_t: return "application/xslt+xml";
  case "xml"_t: return "application/xml";
  case "gz"_t: return "application/gzip";
  case "zip"_t: return "application/zip";
  case "wasm"_t: return "application/wasm";
  }
}